

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_literal<double>::f_emit
          (t_literal<double> *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_emit *ptVar1;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar2;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  undefined8 uVar3;
  t_operand tVar4;
  
  aVar2.v_integer._1_7_ = in_register_00000011;
  aVar2.v_integer._0_1_ = a_tail;
  if (CONCAT31(in_register_00000009,a_operand) == 0) {
    uVar3 = 4;
    if (!a_clear) {
      if (a_tail) {
        t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
        ptVar1 = t_emit::operator<<(a_emit,c_instruction__RETURN_FLOAT);
      }
      else {
        ptVar1 = t_emit::operator<<(a_emit,c_instruction__FLOAT);
        ptVar1 = t_emit::operator<<(ptVar1,a_emit->v_stack);
      }
      t_emit::operator<<(ptVar1,this->v_value);
      t_emit::f_push(a_emit);
      t_emit::f_at(a_emit,&this->super_t_node);
      aVar2 = extraout_RDX;
    }
  }
  else {
    aVar2 = (anon_union_8_4_0f1077ea_for_t_operand_2)this->v_value;
    uVar3 = 1;
  }
  tVar4.field_1.v_integer = aVar2.v_integer;
  tVar4._0_8_ = uVar3;
  return tVar4;
}

Assistant:

t_operand t_literal<T>::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	if (a_operand) return v_value;
	if (a_clear) return {};
	if (a_tail) {
		a_emit.f_emit_safe_point(this);
		a_emit << static_cast<t_instruction>(t_emit::f_instruction_of<T>() + c_instruction__RETURN_NUL - c_instruction__NUL) << v_value;
	} else {
		a_emit << t_emit::f_instruction_of<T>() << a_emit.v_stack << v_value;
	}
	a_emit.f_push();
	a_emit.f_at(this);
	return {};
}